

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

enable_if_t<HasSize<span<const_Vector3<float>_>_>::value_&&_HasData<span<const_Vector3<float>_>_>::value,_std::ostream_&>
 pbrt::detail::operator<<(ostream *os,span<const_pbrt::Vector3<float>_> *v)

{
  ostream *poVar1;
  ulong uVar2;
  Tuple3<pbrt::Vector3,float> *this;
  string local_50;
  
  std::operator<<(os,"[ ");
  this = (Tuple3<pbrt::Vector3,float> *)v->ptr;
  for (uVar2 = 0; uVar2 < v->n; uVar2 = uVar2 + 1) {
    Tuple3<pbrt::Vector3,float>::ToString_abi_cxx11_(&local_50,this);
    std::operator<<(os,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (uVar2 < v->n - 1) {
      std::operator<<(os,", ");
    }
    this = this + 0xc;
  }
  poVar1 = std::operator<<(os," ]");
  return poVar1;
}

Assistant:

inline std::enable_if_t<HasSize<T>::value && HasData<T>::value, std::ostream &>
operator<<(std::ostream &os, const T &v) {
    os << "[ ";
    auto ptr = v.data();
    for (size_t i = 0; i < v.size(); ++i) {
        os << ptr[i];
        if (i < v.size() - 1)
            os << ", ";
    }
    return os << " ]";
}